

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O2

int adiak_executable(void)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char path [4097];
  
  iVar1 = adksys_get_executable(path,0x1001);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    pcVar2 = strrchr(path,0x2f);
    pcVar3 = pcVar2 + 1;
    if (pcVar2 == (char *)0x0) {
      pcVar3 = path;
    }
    iVar1 = 0;
    adiak_namevalue("executable",2,"binary","%s",pcVar3);
  }
  return iVar1;
}

Assistant:

int adiak_executable()
{
   char path[MAX_PATH_LEN+1];
   char *filepart;
   int result;

   result = adksys_get_executable(path, sizeof(path));
   if (result == -1)
      return -1;

   filepart = strrchr(path, '/');
   if (!filepart)
      filepart = path;
   else
      filepart++;

   adiak_namevalue("executable", adiak_general, "binary", "%s", filepart);
   return 0;
}